

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

string * __thiscall GraphPropagator::all_to_dot_abi_cxx11_(GraphPropagator *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  string *in_RDI;
  int e;
  int n;
  string *res;
  int in_stack_fffffffffffffd5c;
  GraphPropagator *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffdac;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [36];
  int local_ec;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  int local_28;
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"graph {\n",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  for (local_28 = 0; iVar3 = local_28, iVar2 = nbNodes((GraphPropagator *)0x2a9f58), iVar3 < iVar2;
      local_28 = local_28 + 1) {
    getNodeVar(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    bVar1 = BoolView::isFixed((BoolView *)0x2a9fa2);
    if (bVar1) {
      getNodeVar(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
      bVar1 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffd60);
      if (bVar1) {
        std::__cxx11::to_string(in_stack_fffffffffffffdac);
        std::operator+((char *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                       (char *)in_stack_fffffffffffffd60);
        std::__cxx11::string::operator+=((string *)in_RDI,local_48);
        std::__cxx11::string::~string(local_48);
        std::__cxx11::string::~string(local_68);
        std::__cxx11::string::~string(local_88);
      }
    }
    getNodeVar(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    bVar1 = BoolView::isFixed((BoolView *)0x2aa158);
    if (bVar1) {
      getNodeVar(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
      bVar1 = BoolView::isFalse((BoolView *)in_stack_fffffffffffffd60);
      in_stack_fffffffffffffdac = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdac);
      if (bVar1) {
        std::__cxx11::to_string(in_stack_fffffffffffffdac);
        std::operator+((char *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                       (char *)in_stack_fffffffffffffd60);
        std::__cxx11::string::operator+=((string *)in_RDI,local_a8);
        std::__cxx11::string::~string(local_a8);
        std::__cxx11::string::~string(local_c8);
        std::__cxx11::string::~string(local_e8);
      }
    }
  }
  local_ec = 0;
  do {
    iVar3 = local_ec;
    iVar2 = nbEdges((GraphPropagator *)0x2aa2dc);
    if (iVar2 <= iVar3) {
      std::__cxx11::string::operator+=((string *)in_RDI,"}");
      return in_RDI;
    }
    getTail(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    std::__cxx11::to_string(in_stack_fffffffffffffdac);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                   (char *)in_stack_fffffffffffffd60);
    iVar3 = getHead(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    std::__cxx11::to_string(in_stack_fffffffffffffdac);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar3,in_stack_fffffffffffffd98),in_stack_fffffffffffffd90);
    std::__cxx11::string::operator+=((string *)in_RDI,local_110);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_170);
    in_stack_fffffffffffffd90 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         getEdgeVar(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    bVar1 = BoolView::isFixed((BoolView *)0x2aa424);
    if (bVar1) {
      getEdgeVar(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
      bVar1 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffd60);
      if (!bVar1) goto LAB_002aa53f;
      std::__cxx11::string::operator+=((string *)in_RDI," [color = red] ");
    }
    else {
LAB_002aa53f:
      getEdgeVar(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
      in_stack_fffffffffffffd6f = BoolView::isFixed((BoolView *)0x2aa564);
      if ((bool)in_stack_fffffffffffffd6f) {
        in_stack_fffffffffffffd60 =
             (GraphPropagator *)getEdgeVar(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
        bVar1 = BoolView::isFalse((BoolView *)in_stack_fffffffffffffd60);
        in_stack_fffffffffffffd5c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd5c);
        if (bVar1) {
          std::__cxx11::string::operator+=((string *)in_RDI," [color = yellow] ");
        }
      }
    }
    std::__cxx11::to_string(in_stack_fffffffffffffdac);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                   (char *)in_stack_fffffffffffffd60);
    std::__cxx11::string::operator+=((string *)in_RDI,local_1b0);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::string::operator+=((string *)in_RDI,";\n");
    local_ec = local_ec + 1;
  } while( true );
}

Assistant:

std::string GraphPropagator::all_to_dot() {
	std::string res = "graph {\n";
	for (int n = 0; n < nbNodes(); n++) {
		if (getNodeVar(n).isFixed() && getNodeVar(n).isTrue()) {
			res += " " + std::to_string(n) + " [color = red];\n";
		}
		if (getNodeVar(n).isFixed() && getNodeVar(n).isFalse()) {
			res += " " + std::to_string(n) + " [color = yellow];\n";
		}
	}
	for (int e = 0; e < nbEdges(); e++) {
		res += " " + std::to_string(getTail(e)) + " -- " + std::to_string(getHead(e));
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue()) {
			res += " [color = red] ";
		} else if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			res += " [color = yellow] ";
		}
		res += "[label = \"" + std::to_string(e) + "\"]";
		res += ";\n";
	}
	res += "}";

	return res;
}